

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatchTest.cpp
# Opt level: O0

void __thiscall
oout::MatchTest::MatchTest(MatchTest *this,shared_ptr<const_oout::Text> *text,string *match)

{
  undefined1 local_40 [16];
  shared_ptr<const_oout::Match> local_30;
  string *local_20;
  string *match_local;
  shared_ptr<const_oout::Text> *text_local;
  MatchTest *this_local;
  
  local_20 = match;
  match_local = (string *)text;
  text_local = (shared_ptr<const_oout::Text> *)this;
  std::make_shared<oout::EqualMatch,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::shared_ptr<oout::Match_const>::shared_ptr<oout::EqualMatch,void>
            ((shared_ptr<oout::Match_const> *)&local_30,(shared_ptr<oout::EqualMatch> *)local_40);
  MatchTest(this,text,&local_30);
  std::shared_ptr<const_oout::Match>::~shared_ptr(&local_30);
  std::shared_ptr<oout::EqualMatch>::~shared_ptr((shared_ptr<oout::EqualMatch> *)local_40);
  return;
}

Assistant:

MatchTest::MatchTest(
	const shared_ptr<const Text> &text,
	const string &match
) : MatchTest(text, make_shared<EqualMatch>(match))
{
}